

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrFragmentOperations.cpp
# Opt level: O1

Vec3 __thiscall rr::advblend::setLumSat(advblend *this,Vec3 *cbase,Vec3 *csat,Vec3 *clum)

{
  float fVar1;
  float fVar2;
  int i;
  long lVar3;
  uint uVar4;
  uint uVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  Vec3 VVar11;
  Vector<float,_3> res_2;
  Vec3 color;
  Vector<float,_3> res;
  Vector<float,_3> res_1;
  float local_48 [4];
  Vec3 local_38;
  float local_28 [4];
  float local_18 [4];
  
  fVar6 = cbase->m_data[0];
  fVar7 = cbase->m_data[1];
  fVar8 = cbase->m_data[2];
  fVar9 = csat->m_data[0];
  fVar1 = csat->m_data[1];
  fVar2 = csat->m_data[2];
  local_38.m_data[2] = 0.0;
  local_38.m_data[0] = 0.0;
  local_38.m_data[1] = 0.0;
  fVar10 = (float)(~-(uint)(fVar7 <= fVar6) & (uint)fVar7 | -(uint)(fVar7 <= fVar6) & (uint)fVar6);
  uVar4 = -(uint)(fVar8 <= fVar10);
  fVar6 = (float)(~-(uint)(fVar6 <= fVar7) & (uint)fVar7 | (uint)fVar6 & -(uint)(fVar6 <= fVar7));
  uVar5 = -(uint)(fVar6 <= fVar8);
  fVar7 = (float)(~uVar5 & (uint)fVar8 | uVar5 & (uint)fVar6);
  fVar6 = (float)(~uVar4 & (uint)fVar8 | uVar4 & (uint)fVar10) - fVar7;
  if (0.0 < fVar6) {
    fVar8 = (float)(~-(uint)(fVar9 <= fVar1) & (uint)fVar1 | -(uint)(fVar9 <= fVar1) & (uint)fVar9);
    uVar4 = -(uint)(fVar8 <= fVar2);
    fVar9 = (float)(~-(uint)(fVar1 <= fVar9) & (uint)fVar1 | (uint)fVar9 & -(uint)(fVar1 <= fVar9));
    uVar5 = -(uint)(fVar2 <= fVar9);
    local_28[2] = 0.0;
    local_28[0] = 0.0;
    local_28[1] = 0.0;
    lVar3 = 0;
    do {
      local_28[lVar3] = cbase->m_data[lVar3] - fVar7;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    local_18[2] = 0.0;
    local_18[0] = 0.0;
    local_18[1] = 0.0;
    lVar3 = 0;
    do {
      local_18[lVar3] =
           local_28[lVar3] *
           ((float)(~uVar5 & (uint)fVar2 | uVar5 & (uint)fVar9) -
           (float)(~uVar4 & (uint)fVar2 | uVar4 & (uint)fVar8));
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    local_48[2] = 0.0;
    local_48[0] = 0.0;
    local_48[1] = 0.0;
    lVar3 = 0;
    do {
      local_48[lVar3] = local_18[lVar3] / fVar6;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    local_38.m_data[2] = local_48[2];
    local_38.m_data[0] = local_48[0];
    local_38.m_data[1] = local_48[1];
  }
  VVar11 = setLum(&local_38,clum);
  return (Vec3)VVar11.m_data;
}

Assistant:

Vec3 setLumSat (const Vec3& cbase, const Vec3& csat, const Vec3& clum)
{
	const float		minbase	= minComp(cbase);
	const float		sbase	= saturation(cbase);
	const float		ssat	= saturation(csat);
	Vec3			color	= Vec3(0.0f);

	if (sbase > 0.0f)
		color = (cbase - minbase) * ssat / sbase;
	else
		color = color;

	return setLum(color, clum);
}